

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall IRBuilder::BuildBr(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  ByteCodeReader *this_00;
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  OpCode OVar4;
  uint uVar5;
  undefined4 *puVar6;
  OpLayoutBr *pOVar7;
  BranchInstr *branchInstr;
  ulong uVar8;
  SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
  *this_01;
  uint32 targetOffset_00;
  Pair<unsigned_int,_bool,_DefaultComparer> local_44;
  uint32 local_3c;
  uint32 local_38;
  uint32 offset_local;
  uint targetOffset;
  
  local_3c = offset;
  offset_local = offset;
  bVar3 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1c98,"(!OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "!OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar3) goto LAB_0048de42;
    *puVar6 = 0;
  }
  this_00 = &this->m_jnReader;
  pOVar7 = Js::ByteCodeReader::Br(this_00);
  uVar5 = Js::ByteCodeReader::GetCurrentOffset(this_00);
  targetOffset_00 = (int)pOVar7->RelativeJumpOffset + uVar5;
  local_38 = targetOffset_00;
  OVar4 = Js::ByteCodeReader::PeekOp(this_00);
  if (OVar4 == BrLong) {
    ConsumeBranchIsland(this);
  }
  if (newOpcode == EndSwitch) {
    SwitchIRBuilder::EndSwitch(&this->m_switchBuilder,offset_local,targetOffset_00);
    return;
  }
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,PerfHintPhase);
  if (((ushort)(newOpcode - TryCatch) < 2) && (bVar3)) {
    WritePerfHint(HasTryBlock,this->m_func,offset_local);
  }
  if ((OVar4 == BrLong) &&
     (uVar5 = Js::ByteCodeReader::GetCurrentOffset(this_00), targetOffset_00 == uVar5)) {
    if (this->m_offsetToInstructionCount <= offset_local) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1cb8,"(offset < m_offsetToInstructionCount)",
                         "offset < m_offsetToInstructionCount");
      if (!bVar3) goto LAB_0048de42;
      *puVar6 = 0;
    }
    uVar8 = (ulong)offset_local;
    pIVar1 = this->m_offsetToInstruction[uVar8];
    if (pIVar1 == (Instr *)0x0) {
      this->m_offsetToInstruction[uVar8] = (Instr *)0xffffffffffffffff;
      JsUtil::
      BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this->longBranchMap,&local_3c,&local_38);
      return;
    }
    if ((pIVar1->m_opcode != StatementBoundary) &&
       ((bVar3 = Js::ConfigFlagsTable::IsEnabled
                           ((ConfigFlagsTable *)&Js::Configuration::Global,
                            BailOutAtEveryByteCodeFlag), !bVar3 ||
        (this->m_offsetToInstruction[uVar8]->m_opcode != BailOnEqual)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1cc9,
                         "(m_offsetToInstruction[offset]->m_opcode == Js::OpCode::StatementBoundary || (Js::Configuration::Global.flags.IsEnabled(Js::BailOutAtEveryByteCodeFlag) && m_offsetToInstruction[offset]->m_opcode == Js::OpCode::BailOnEqual))"
                         ,
                         "m_offsetToInstruction[offset]->m_opcode == Js::OpCode::StatementBoundary || (Js::Configuration::Global.flags.IsEnabled(Js::BailOutAtEveryByteCodeFlag) && m_offsetToInstruction[offset]->m_opcode == Js::OpCode::BailOnEqual)"
                        );
      if (!bVar3) {
LAB_0048de42:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
  }
  if (newOpcode == TryFinally) {
    this_01 = this->handlerOffsetStack;
    if (this_01 ==
        (SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
         *)0x0) goto LAB_0048ddfa;
    local_44.second = false;
    local_44.initialized = true;
  }
  else {
    if ((newOpcode != TryCatch) ||
       (this_01 = this->handlerOffsetStack,
       this_01 ==
       (SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
        *)0x0)) goto LAB_0048ddfa;
    local_44.second = true;
    local_44.initialized = true;
  }
  local_44.first = targetOffset_00;
  SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>::
  Prepend(this_01,&local_44);
LAB_0048ddfa:
  branchInstr = IR::BranchInstr::New(newOpcode,(LabelInstr *)0x0,this->m_func);
  AddBranchInstr(this,branchInstr,offset_local,targetOffset_00);
  return;
}

Assistant:

void
IRBuilder::BuildBr(Js::OpCode newOpcode, uint32 offset)
{
    Assert(!OpCodeAttr::HasMultiSizeLayout(newOpcode));

    IR::BranchInstr * branchInstr;
    const unaligned   Js::OpLayoutBr *branchInsn = m_jnReader.Br();
    unsigned int      targetOffset = m_jnReader.GetCurrentOffset() + branchInsn->RelativeJumpOffset;
#ifdef BYTECODE_BRANCH_ISLAND
    bool isLongBranchIsland = (m_jnReader.PeekOp() == Js::OpCode::BrLong);
    if (isLongBranchIsland)
    {
        ConsumeBranchIsland();
    }
#endif

    if(newOpcode == Js::OpCode::EndSwitch)
    {
        m_switchBuilder.EndSwitch(offset, targetOffset);
        return;
    }
#ifdef PERF_HINT
    else if (PHASE_TRACE1(Js::PerfHintPhase) && (newOpcode == Js::OpCode::TryCatch || newOpcode == Js::OpCode::TryFinally) )
    {
        WritePerfHint(PerfHints::HasTryBlock, this->m_func, offset);
    }
#endif

#ifdef BYTECODE_BRANCH_ISLAND
    if (isLongBranchIsland && (targetOffset == (uint)m_jnReader.GetCurrentOffset()))
    {
        // Branch to next (probably after consume branch island), try to not emit the branch

        // Mark the jump around instruction as a virtual long branch as well so we can just
        // fall through instead of branch to exit
        Assert(offset < m_offsetToInstructionCount);
        if (m_offsetToInstruction[offset] == nullptr)
        {
            m_offsetToInstruction[offset] = VirtualLongBranchInstr;
            longBranchMap->Add(offset, targetOffset);
            return;
        }

        // We may have already create an instruction on this offset as a statement boundary
        // or in the bailout at every byte code case.

        // The statement boundary case only happens if we have emitted the long branch island
        // after an existing no fall through instruction, but that instruction also happen to be
        // branch to next.  We will just generate an actual branch to next instruction.

        Assert(m_offsetToInstruction[offset]->m_opcode == Js::OpCode::StatementBoundary
            || (Js::Configuration::Global.flags.IsEnabled(Js::BailOutAtEveryByteCodeFlag)
            && m_offsetToInstruction[offset]->m_opcode == Js::OpCode::BailOnEqual));
    }
#endif

    if ((newOpcode == Js::OpCode::TryCatch) && this->handlerOffsetStack)
    {
        this->handlerOffsetStack->Push(Pair<uint, bool>(targetOffset, true));
    }
    else if ((newOpcode == Js::OpCode::TryFinally) && this->handlerOffsetStack)
    {
        this->handlerOffsetStack->Push(Pair<uint, bool>(targetOffset, false));
    }
    branchInstr = IR::BranchInstr::New(newOpcode, nullptr, m_func);
    this->AddBranchInstr(branchInstr, offset, targetOffset);
}